

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O2

Translator * __thiscall
helics::ConnectorFederateManager::getTranslator(ConnectorFederateManager *this,string_view name)

{
  Translator *pTVar1;
  BlockIterator<const_helics::Translator,_32,_const_helics::Translator_*const_*> tran;
  shared_handle sharedTran;
  BlockIterator<const_helics::Translator,_32,_const_helics::Translator_*const_*> local_60;
  shared_handle local_48;
  const_iterator local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock_shared(&local_48,&this->translators);
  gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>::find
            (&local_60,local_48.data,name);
  gmlc::containers::StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_>::
  end(&local_30,&(local_48.data)->dataStorage);
  pTVar1 = (Translator *)invalidTran;
  if (local_60.vec != local_30.vec) {
    pTVar1 = local_60.ptr;
  }
  if (local_60.offset != local_30.offset) {
    pTVar1 = local_60.ptr;
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_48.m_handle_lock);
  return pTVar1;
}

Assistant:

const Translator& ConnectorFederateManager::getTranslator(std::string_view name) const
{
    auto sharedTran = translators.lock_shared();
    auto tran = sharedTran->find(name);
    return (tran != sharedTran.end()) ? (*tran) : invalidTran;
}